

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void draw_8_handles_for_rect
               (int left,int top,int width,int height,bool filled,Am_Drawonable *draw,
               Am_Style *style,Am_Object *handle_shape,Am_Style *special_style,
               Am_Move_Grow_Where_Attach special_style_where)

{
  Am_Style *pAVar1;
  int top_00;
  int top_01;
  int iVar2;
  Am_Style local_70;
  Am_Style local_68;
  Am_Style local_60;
  Am_Style local_58;
  Am_Style local_50;
  Am_Style local_48;
  Am_Style local_40;
  Am_Style local_38;
  
  pAVar1 = style;
  if (Am_ATTACH_NW.value == special_style_where.value) {
    pAVar1 = special_style;
  }
  Am_Style::Am_Style(&local_38,pAVar1);
  draw_handle(left,top,filled,draw,&local_38,handle_shape);
  Am_Style::~Am_Style(&local_38);
  top_00 = top + -7 + height / 2;
  pAVar1 = style;
  if (Am_ATTACH_W.value == special_style_where.value) {
    pAVar1 = special_style;
  }
  Am_Style::Am_Style(&local_40,pAVar1);
  draw_handle(left,top_00,filled,draw,&local_40,handle_shape);
  Am_Style::~Am_Style(&local_40);
  top_01 = top + -0xd + height;
  pAVar1 = style;
  if (Am_ATTACH_SW.value == special_style_where.value) {
    pAVar1 = special_style;
  }
  Am_Style::Am_Style(&local_48,pAVar1);
  draw_handle(left,top_01,filled,draw,&local_48,handle_shape);
  Am_Style::~Am_Style(&local_48);
  iVar2 = left + -7 + width / 2;
  pAVar1 = style;
  if (Am_ATTACH_N.value == special_style_where.value) {
    pAVar1 = special_style;
  }
  Am_Style::Am_Style(&local_50,pAVar1);
  draw_handle(iVar2,top,filled,draw,&local_50,handle_shape);
  Am_Style::~Am_Style(&local_50);
  pAVar1 = style;
  if (Am_ATTACH_S.value == special_style_where.value) {
    pAVar1 = special_style;
  }
  Am_Style::Am_Style(&local_58,pAVar1);
  draw_handle(iVar2,top_01,filled,draw,&local_58,handle_shape);
  Am_Style::~Am_Style(&local_58);
  iVar2 = left + -0xd + width;
  pAVar1 = style;
  if (Am_ATTACH_NE.value == special_style_where.value) {
    pAVar1 = special_style;
  }
  Am_Style::Am_Style(&local_60,pAVar1);
  draw_handle(iVar2,top,filled,draw,&local_60,handle_shape);
  Am_Style::~Am_Style(&local_60);
  pAVar1 = style;
  if (Am_ATTACH_E.value == special_style_where.value) {
    pAVar1 = special_style;
  }
  Am_Style::Am_Style(&local_68,pAVar1);
  draw_handle(iVar2,top_00,filled,draw,&local_68,handle_shape);
  Am_Style::~Am_Style(&local_68);
  if (Am_ATTACH_SE.value == special_style_where.value) {
    style = special_style;
  }
  Am_Style::Am_Style(&local_70,style);
  draw_handle(iVar2,top_01,filled,draw,&local_70,handle_shape);
  Am_Style::~Am_Style(&local_70);
  return;
}

Assistant:

void
draw_8_handles_for_rect(
    int left, int top, int width, int height, bool filled, Am_Drawonable *draw,
    Am_Style style,
    Am_Object &handle_shape, //supports multiple users
    Am_Style special_style = Am_No_Style,
    Am_Move_Grow_Where_Attach special_style_where = Am_ATTACH_WHERE_HIT // 0
    )
{
  int width_d2 = width / 2;
  int height_d2 = height / 2;

  // left-top
  draw_handle(left, top, filled, draw,
              (special_style_where == Am_ATTACH_NW) ? special_style : style,
              handle_shape); //supports multiple users
  //left-middle
  draw_handle(left, top + height_d2 - HANDLE_SIZE_D2, filled, draw,
              (special_style_where == Am_ATTACH_W) ? special_style : style,
              handle_shape); //supports multiple users
  //left-bottom
  draw_handle(left, top + height - HANDLE_SIZE, filled, draw,
              (special_style_where == Am_ATTACH_SW) ? special_style : style,
              handle_shape); //supports multiple users

  // middle-top
  draw_handle(left + width_d2 - HANDLE_SIZE_D2, top, filled, draw,
              (special_style_where == Am_ATTACH_N) ? special_style : style,
              handle_shape); //supports multiple users
  //middle-bottom
  draw_handle(left + width_d2 - HANDLE_SIZE_D2, top + height - HANDLE_SIZE,
              filled, draw,
              (special_style_where == Am_ATTACH_S) ? special_style : style,
              handle_shape); //supports multiple users

  // right-top
  draw_handle(left + width - HANDLE_SIZE, top, filled, draw,
              (special_style_where == Am_ATTACH_NE) ? special_style : style,
              handle_shape); //supports multiple users

  // right-middle
  draw_handle(left + width - HANDLE_SIZE, top + height_d2 - HANDLE_SIZE_D2,
              filled, draw,
              (special_style_where == Am_ATTACH_E) ? special_style : style,
              handle_shape); //supports multiple users
  // right-bottom
  draw_handle(left + width - HANDLE_SIZE, top + height - HANDLE_SIZE, filled,
              draw,
              (special_style_where == Am_ATTACH_SE) ? special_style : style,
              handle_shape); //supports multiple users
}